

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone::save(xr_bone *this,xr_writer *w)

{
  xr_writer *w_local;
  xr_bone *this_local;
  
  xr_writer::w_chunk<unsigned_short>(w,1,&BONE_VERSION);
  xr_writer::open_chunk(w,2);
  xr_writer::w_sz(w,&this->m_name);
  xr_writer::w_sz(w,&this->m_parent_name);
  xr_writer::w_sz(w,&this->m_vmap_name);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,3);
  xr_writer::w_fvector3(w,&this->m_bind_offset);
  xr_writer::w_fvector3(w,&this->m_bind_rotate);
  xr_writer::w_float(w,this->m_bind_length);
  xr_writer::close_chunk(w);
  save_data(this,w);
  return;
}

Assistant:

void xr_bone::save(xr_writer& w) const
{
	w.w_chunk<uint16_t>(BONE_CHUNK_VERSION, BONE_VERSION);

	w.open_chunk(BONE_CHUNK_DEF);	// first type!
	w.w_sz(m_name);
	w.w_sz(m_parent_name);
	w.w_sz(m_vmap_name);
	w.close_chunk();

	w.open_chunk(BONE_CHUNK_BIND_POSE);
	w.w_fvector3(m_bind_offset);
	w.w_fvector3(m_bind_rotate);
	w.w_float(m_bind_length);
	w.close_chunk();

	save_data(w);
}